

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-logging.cc
# Opt level: O3

Result __thiscall
wabt::BinaryReaderLogging::OnElemSegmentElemType
          (BinaryReaderLogging *this,Index index,Type elem_type)

{
  Stream *this_00;
  Enum EVar1;
  Type local_50;
  string local_48;
  
  local_50 = elem_type;
  WriteIndent(this);
  this_00 = this->stream_;
  Type::GetName_abi_cxx11_(&local_48,&local_50);
  Stream::Writef(this_00,"OnElemSegmentElemType(index: %u, type: %s)\n",index,
                 local_48._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  EVar1 = (*this->reader_->_vptr_BinaryReaderDelegate[0x96])(this->reader_,index,local_50);
  return (Result)EVar1;
}

Assistant:

Result BinaryReaderLogging::OnElemSegmentElemType(Index index, Type elem_type) {
  LOGF("OnElemSegmentElemType(index: %" PRIindex ", type: %s)\n", index,
       elem_type.GetName().c_str());
  return reader_->OnElemSegmentElemType(index, elem_type);
}